

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx2_naive_counter(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [32];
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int p;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  uint32_t out_counters [16];
  __m256i counters [16];
  __m256i masks [16];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_260 [600];
  
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  local_2c0 = vmovdqa64_avx512f(auVar16);
  local_300 = vmovdqa64_avx512f(auVar16);
  local_340 = vmovdqa64_avx512f(auVar16);
  local_380 = vmovdqa64_avx512f(auVar16);
  local_3c0 = vmovdqa64_avx512f(auVar16);
  local_400 = vmovdqa64_avx512f(auVar16);
  local_440 = vmovdqa64_avx512f(auVar16);
  local_480 = vmovdqa64_avx512f(auVar16);
  pauVar4 = (undefined1 (*) [32])local_260;
  lVar5 = 0;
  do {
    auVar12 = vpbroadcastw_avx512vl();
    *pauVar4 = auVar12;
    lVar5 = lVar5 + 1;
    pauVar4 = pauVar4 + 1;
  } while (lVar5 != 0x10);
  local_4c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  uVar8 = 0;
  if (0xfffff < len) {
    uVar6 = 0;
    uVar8 = 0;
    do {
      uVar9 = uVar8 + 0xffff;
      uVar7 = uVar8;
      do {
        auVar12 = *(undefined1 (*) [32])(data + (ulong)uVar7 * 0x10);
        lVar5 = 0;
        lVar10 = 0;
        do {
          auVar3 = vpand_avx2(auVar12,*(undefined1 (*) [32])(local_260 + lVar5));
          auVar3 = vpsrlw_avx2(auVar3,ZEXT416((uint)lVar10));
          auVar3 = vpaddw_avx2(auVar3,*(undefined1 (*) [32])(local_480 + lVar5));
          *(undefined1 (*) [32])(local_480 + lVar5) = auVar3;
          lVar10 = lVar10 + 1;
          lVar5 = lVar5 + 0x20;
        } while (lVar10 != 0x10);
        uVar8 = uVar7 + 1;
        bVar11 = uVar7 != uVar9;
        uVar7 = uVar8;
      } while (bVar11);
      lVar5 = 0;
      do {
        auVar16 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_480 + lVar5 * 8));
        auVar16 = vpaddd_avx512f(ZEXT464(*(uint *)(local_4c0 + lVar5)),auVar16);
        auVar12 = vextracti64x4_avx512f(auVar16,1);
        auVar16 = vpaddd_avx512f(auVar16,ZEXT3264(auVar12));
        auVar1 = vpaddd_avx(auVar16._0_16_,auVar16._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        auVar2 = vpshufd_avx(auVar1,0x55);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        *(int *)(local_4c0 + lVar5) = auVar1._0_4_;
        lVar10 = lVar5 * 8;
        *(undefined8 *)(local_480 + lVar10) = 0;
        *(undefined8 *)(local_480 + lVar10 + 8) = 0;
        *(undefined8 *)(local_480 + lVar10 + 0x10) = 0;
        *(undefined8 *)(local_480 + lVar10 + 0x18) = 0;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x40);
      uVar6 = uVar6 + 1;
    } while (uVar6 != len >> 0x14);
    uVar8 = uVar8 * 0x10;
  }
  if (uVar8 < len) {
    uVar6 = (ulong)uVar8;
    auVar16 = vmovdqa64_avx512f(local_4c0);
    auVar13 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar15 = vpbroadcastd_avx512f();
      auVar15 = vpsrlvd_avx512f(auVar15,auVar13);
      auVar15 = vpandd_avx512f(auVar15,auVar14);
      auVar16 = vpaddd_avx512f(auVar15,auVar16);
      uVar6 = uVar6 + 1;
    } while (len != uVar6);
    local_4c0 = vmovdqa64_avx512f(auVar16);
  }
  *(undefined8 *)flags = local_4c0._0_8_;
  *(undefined8 *)(flags + 2) = local_4c0._8_8_;
  *(undefined8 *)(flags + 4) = local_4c0._16_8_;
  *(undefined8 *)(flags + 6) = local_4c0._24_8_;
  *(undefined8 *)(flags + 8) = local_4c0._32_8_;
  *(undefined8 *)(flags + 10) = local_4c0._40_8_;
  *(undefined8 *)(flags + 0xc) = local_4c0._48_8_;
  *(undefined8 *)(flags + 0xe) = local_4c0._56_8_;
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_naive_counter(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i counters[16];
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm256_set1_epi16(1 << i);
        counters[i] = _mm256_set1_epi16(0);
    }
    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 65536;

#define UPDATE(idx) counters[idx]  = _mm256_add_epi16(counters[idx],  _mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx))

    uint32_t pos = 0;
    for (size_t i = 0; i < n_update_cycles; ++i) { // each block of 2^16 values
        for (int k = 0; k < 65536; ++pos,++k) { // max sum of each 16-bit value in a register
            for (int p = 0; p < 16; ++p) // Not unrolled
                UPDATE(p);
        }

        // Compute vector sum
        for (int k = 0; k < 16; ++k) { // each flag register
            // Naive counter
            uint16_t* d = (uint16_t*)(&counters[k]);
            for (int j = 0; j < 16; ++j) // each uint16_t in the register
                out_counters[k] += d[j];

            counters[k] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef UPDATE

    return 0;
}